

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O0

duration<double,_std::ratio<1L,_1L>_>
testNew<intgemm::SSSE3::Kernels8>(Index A_rows,Index width,Index B_cols)

{
  UnquantizeAndAddBiasAndWrite callback;
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  type this;
  result_type_conflict rVar4;
  time_point end;
  time_point start;
  float unquant_mult_forprep;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<unsigned_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float alpha;
  float *it_2;
  float *__end1_2;
  float *__begin1_2;
  AlignedVector<float> *__range1_2;
  float *it_1;
  float *__end1_1;
  float *__begin1_1;
  AlignedVector<float> *__range1_1;
  float *it;
  float *__end1;
  float *__begin1;
  AlignedVector<float> *__range1;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffea88;
  Index cols;
  uniform_real_distribution<float> *in_stack_ffffffffffffea90;
  uint8_t *in_stack_ffffffffffffea98;
  AlignedVector<float> *in_stack_ffffffffffffeaa0;
  undefined8 in_stack_ffffffffffffeac8;
  Index cols_00;
  undefined8 in_stack_ffffffffffffead0;
  undefined4 in_stack_ffffffffffffead8;
  undefined4 in_stack_ffffffffffffeadc;
  float *in_stack_ffffffffffffeae0;
  AlignedVector<float> *this_00;
  UnquantizeAndAddBiasAndWrite local_14c8;
  undefined8 local_14b0;
  UnquantizeAndAddBiasAndWrite local_14a8;
  float local_148c;
  AlignedVector<float> local_1488;
  AlignedVector<signed_char> local_1478;
  AlignedVector<unsigned_char> local_1468;
  float local_1454;
  undefined4 local_1450;
  float local_144c;
  float *local_1448;
  float *local_1440;
  float *local_1438;
  AlignedVector<float> *local_1430;
  float *local_1428;
  float *local_1420;
  float *local_1418;
  AlignedVector<float> *local_1410;
  float *local_1408;
  float *local_1400;
  float *local_13f8;
  AlignedVector<float> *local_13f0;
  Index in_stack_ffffffffffffec78;
  Index in_stack_ffffffffffffec7c;
  int8_t *in_stack_ffffffffffffec80;
  Index in_stack_ffffffffffffec8c;
  Index in_stack_ffffffffffffec90;
  Index in_stack_ffffffffffffec94;
  int8_t *in_stack_ffffffffffffec98;
  float *in_stack_ffffffffffffeca0;
  UnquantizeAndAddBiasAndWrite in_stack_ffffffffffffecb0;
  AlignedVector<float> local_58 [2];
  AlignedVector<float> local_38;
  AlignedVector<float> local_28 [2];
  rep_conflict local_8;
  
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaa0,(size_t)in_stack_ffffffffffffea98,
             (size_t)in_stack_ffffffffffffea90);
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaa0,(size_t)in_stack_ffffffffffffea98,
             (size_t)in_stack_ffffffffffffea90);
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaa0,(size_t)in_stack_ffffffffffffea98,
             (size_t)in_stack_ffffffffffffea90);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1098ad);
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffea90,(float)((ulong)in_stack_ffffffffffffea88 >> 0x20),
             SUB84(in_stack_ffffffffffffea88,0));
  local_13f0 = local_28;
  local_13f8 = intgemm::AlignedVector<float>::begin(local_13f0);
  local_1400 = intgemm::AlignedVector<float>::end(local_13f0);
  for (; local_13f8 != local_1400; local_13f8 = local_13f8 + 1) {
    local_1408 = local_13f8;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88);
    *local_1408 = rVar4;
  }
  local_1410 = &local_38;
  local_1418 = intgemm::AlignedVector<float>::begin(local_1410);
  local_1420 = intgemm::AlignedVector<float>::end(local_1410);
  for (; local_1418 != local_1420; local_1418 = local_1418 + 1) {
    local_1428 = local_1418;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88);
    *local_1428 = rVar4;
  }
  local_1430 = local_58;
  local_1438 = intgemm::AlignedVector<float>::begin(local_1430);
  local_1440 = intgemm::AlignedVector<float>::end(local_1430);
  for (; cols_00 = (Index)((ulong)in_stack_ffffffffffffeac8 >> 0x20), local_1438 != local_1440;
      local_1438 = local_1438 + 1) {
    local_1448 = local_1438;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88);
    *local_1448 = rVar4;
  }
  local_144c = 2.0;
  local_1450 = 0x427e0000;
  local_1454 = 0.0002480005;
  intgemm::AlignedVector<float>::size(local_28);
  cols = (Index)((ulong)in_stack_ffffffffffffea88 >> 0x20);
  intgemm::AlignedVector<unsigned_char>::AlignedVector
            ((AlignedVector<unsigned_char> *)in_stack_ffffffffffffeaa0,
             (size_t)in_stack_ffffffffffffea98,(size_t)in_stack_ffffffffffffea90);
  intgemm::AlignedVector<float>::size(&local_38);
  intgemm::AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffeaa0,
             (size_t)in_stack_ffffffffffffea98,(size_t)in_stack_ffffffffffffea90);
  intgemm::AlignedVector<float>::begin(local_28);
  intgemm::AlignedVector<unsigned_char>::begin(&local_1468);
  intgemm::SSSE3::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98,
             (float)((ulong)in_stack_ffffffffffffea90 >> 0x20),(Index)in_stack_ffffffffffffea90,cols
            );
  intgemm::AlignedVector<float>::begin(&local_38);
  intgemm::AlignedVector<signed_char>::begin(&local_1478);
  intgemm::SSSE3::Kernels8::PrepareB
            (in_stack_ffffffffffffeae0,
             (int8_t *)CONCAT44(in_stack_ffffffffffffeadc,in_stack_ffffffffffffead8),
             (float)((ulong)in_stack_ffffffffffffead0 >> 0x20),(Index)in_stack_ffffffffffffead0,
             cols_00);
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaa0,(size_t)in_stack_ffffffffffffea98,
             (size_t)in_stack_ffffffffffffea90);
  local_148c = (-local_144c * local_144c) / 127.0;
  intgemm::AlignedVector<signed_char>::begin(&local_1478);
  fVar1 = local_148c;
  this_00 = local_58;
  pfVar2 = intgemm::AlignedVector<float>::begin(this_00);
  pfVar3 = intgemm::AlignedVector<float>::begin(this_00);
  intgemm::callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_14a8,fVar1,pfVar2,pfVar3);
  callback._4_4_ = in_stack_ffffffffffffec94;
  callback.unquant_mult = (float)in_stack_ffffffffffffec90;
  callback.bias_addr = (float *)in_stack_ffffffffffffec98;
  callback.output_addr = in_stack_ffffffffffffeca0;
  intgemm::SSSE3::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_ffffffffffffec80,in_stack_ffffffffffffec7c,in_stack_ffffffffffffec78,callback)
  ;
  local_14b0 = std::chrono::_V2::system_clock::now();
  intgemm::AlignedVector<unsigned_char>::begin(&local_1468);
  intgemm::AlignedVector<signed_char>::begin(&local_1478);
  fVar1 = local_1454;
  pfVar2 = intgemm::AlignedVector<float>::begin(local_58);
  pfVar3 = intgemm::AlignedVector<float>::begin(&local_1488);
  intgemm::callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_14c8,fVar1,pfVar2,pfVar3);
  intgemm::SSSE3::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            ((uint8_t *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
             in_stack_ffffffffffffec94,in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c,
             in_stack_ffffffffffffecb0);
  std::chrono::_V2::system_clock::now();
  this = std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)local_14c8.output_addr,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)local_14c8.bias_addr);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this.__r,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)local_14c8.output_addr);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x109e69);
  intgemm::AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x109e76);
  intgemm::AlignedVector<unsigned_char>::~AlignedVector((AlignedVector<unsigned_char> *)0x109e83);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x109e90);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x109e9d);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x109eaa);
  return (duration<double,_std::ratio<1L,_1L>_>)local_8;
}

Assistant:

std::chrono::duration<double> testNew(Index A_rows, Index width, Index B_cols) {
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  float unquant_mult_forprep = (-1)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  auto start = std::chrono::system_clock::now();
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));
  auto end = std::chrono::system_clock::now();

  std::chrono::duration<double> elapsed_seconds = end-start;
  return elapsed_seconds;

}